

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O1

ConfusableMatcher * LidlNormalizerCMSetup(void)

{
  pointer pcVar1;
  ConfusableMatcher *this;
  long *plVar2;
  ulong uVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vals;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  allocator_type local_1b69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b38;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b20;
  undefined1 local_1b08 [32];
  _Alloc_hider local_1ae8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1ad8;
  undefined1 *local_1ac8 [2];
  undefined1 local_1ab8 [16];
  undefined1 *local_1aa8 [2];
  undefined1 local_1a98 [16];
  undefined1 *local_1a88 [2];
  undefined1 local_1a78 [16];
  undefined1 *local_1a68 [2];
  undefined1 local_1a58 [16];
  undefined1 *local_1a48 [2];
  undefined1 local_1a38 [16];
  undefined1 *local_1a28 [2];
  undefined1 local_1a18 [16];
  undefined1 *local_1a08 [2];
  undefined1 local_19f8 [16];
  undefined1 *local_19e8 [2];
  undefined1 local_19d8 [16];
  undefined1 *local_19c8 [2];
  undefined1 local_19b8 [16];
  undefined1 *local_19a8 [2];
  undefined1 local_1998 [16];
  undefined1 *local_1988 [2];
  undefined1 local_1978 [16];
  undefined1 *local_1968 [2];
  undefined1 local_1958 [16];
  undefined1 *local_1948 [2];
  undefined1 local_1938 [16];
  undefined1 *local_1928 [2];
  undefined1 local_1918 [16];
  undefined1 *local_1908 [2];
  undefined1 local_18f8 [16];
  undefined1 *local_18e8 [2];
  undefined1 local_18d8 [16];
  undefined1 *local_18c8 [2];
  undefined1 local_18b8 [16];
  undefined1 *local_18a8 [2];
  undefined1 local_1898 [16];
  undefined1 *local_1888 [2];
  undefined1 local_1878 [16];
  undefined1 *local_1868 [2];
  undefined1 local_1858 [16];
  undefined1 *local_1848 [2];
  undefined1 local_1838 [16];
  undefined1 *local_1828 [2];
  undefined1 local_1818 [16];
  undefined1 *local_1808 [2];
  undefined1 local_17f8 [16];
  undefined1 *local_17e8 [2];
  undefined1 local_17d8 [16];
  undefined1 *local_17c8 [2];
  undefined1 local_17b8 [16];
  undefined1 *local_17a8 [2];
  undefined1 local_1798 [16];
  undefined1 *local_1788 [2];
  undefined1 local_1778 [16];
  undefined1 *local_1768 [2];
  undefined1 local_1758 [16];
  undefined1 *local_1748 [2];
  undefined1 local_1738 [16];
  undefined1 *local_1728 [2];
  undefined1 local_1718 [16];
  undefined1 *local_1708 [2];
  undefined1 local_16f8 [16];
  undefined1 *local_16e8 [2];
  undefined1 local_16d8 [16];
  undefined1 *local_16c8 [2];
  undefined1 local_16b8 [16];
  undefined1 *local_16a8 [2];
  undefined1 local_1698 [16];
  undefined1 *local_1688 [2];
  undefined1 local_1678 [16];
  undefined1 *local_1668 [2];
  undefined1 local_1658 [16];
  undefined1 *local_1648 [2];
  undefined1 local_1638 [16];
  undefined1 *local_1628 [2];
  undefined1 local_1618 [16];
  undefined1 *local_1608 [2];
  undefined1 local_15f8 [16];
  undefined1 *local_15e8 [2];
  undefined1 local_15d8 [16];
  undefined1 *local_15c8 [2];
  undefined1 local_15b8 [16];
  undefined1 *local_15a8 [2];
  undefined1 local_1598 [16];
  undefined1 *local_1588 [2];
  undefined1 local_1578 [16];
  undefined1 *local_1568 [2];
  undefined1 local_1558 [16];
  undefined1 *local_1548 [2];
  undefined1 local_1538 [16];
  undefined1 *local_1528 [2];
  undefined1 local_1518 [16];
  undefined1 *local_1508 [2];
  undefined1 local_14f8 [16];
  undefined1 *local_14e8 [2];
  undefined1 local_14d8 [16];
  undefined1 *local_14c8 [2];
  undefined1 local_14b8 [16];
  undefined1 *local_14a8 [2];
  undefined1 local_1498 [16];
  undefined1 *local_1488 [2];
  undefined1 local_1478 [16];
  undefined1 *local_1468 [2];
  undefined1 local_1458 [16];
  undefined1 *local_1448 [2];
  undefined1 local_1438 [16];
  undefined1 *local_1428 [2];
  undefined1 local_1418 [16];
  undefined1 *local_1408 [2];
  undefined1 local_13f8 [16];
  undefined1 *local_13e8 [2];
  undefined1 local_13d8 [16];
  undefined1 *local_13c8 [2];
  undefined1 local_13b8 [16];
  undefined1 *local_13a8 [2];
  undefined1 local_1398 [16];
  undefined1 *local_1388 [2];
  undefined1 local_1378 [16];
  undefined1 *local_1368 [2];
  undefined1 local_1358 [16];
  undefined1 *local_1348 [2];
  undefined1 local_1338 [16];
  undefined1 *local_1328 [2];
  undefined1 local_1318 [16];
  undefined1 *local_1308 [2];
  undefined1 local_12f8 [16];
  undefined1 *local_12e8 [2];
  undefined1 local_12d8 [16];
  undefined1 *local_12c8 [2];
  undefined1 local_12b8 [16];
  undefined1 *local_12a8 [2];
  undefined1 local_1298 [16];
  undefined1 *local_1288 [2];
  undefined1 local_1278 [16];
  undefined1 *local_1268 [2];
  undefined1 local_1258 [16];
  undefined1 *local_1248 [2];
  undefined1 local_1238 [16];
  undefined1 *local_1228 [2];
  undefined1 local_1218 [16];
  undefined1 *local_1208 [2];
  undefined1 local_11f8 [16];
  undefined1 *local_11e8 [2];
  undefined1 local_11d8 [16];
  undefined1 *local_11c8 [2];
  undefined1 local_11b8 [16];
  undefined1 *local_11a8 [2];
  undefined1 local_1198 [16];
  undefined1 *local_1188 [2];
  undefined1 local_1178 [16];
  undefined1 *local_1168 [2];
  undefined1 local_1158 [16];
  undefined1 *local_1148 [2];
  undefined1 local_1138 [16];
  undefined1 *local_1128 [2];
  undefined1 local_1118 [16];
  undefined1 *local_1108 [2];
  undefined1 local_10f8 [16];
  undefined1 *local_10e8 [2];
  undefined1 local_10d8 [16];
  undefined1 *local_10c8 [2];
  undefined1 local_10b8 [16];
  undefined1 *local_10a8 [2];
  undefined1 local_1098 [16];
  undefined1 *local_1088 [2];
  undefined1 local_1078 [16];
  undefined1 *local_1068 [2];
  undefined1 local_1058 [16];
  undefined1 *local_1048 [2];
  undefined1 local_1038 [16];
  undefined1 *local_1028 [2];
  undefined1 local_1018 [16];
  undefined1 *local_1008 [2];
  undefined1 local_ff8 [16];
  undefined1 *local_fe8 [2];
  undefined1 local_fd8 [16];
  undefined1 *local_fc8 [2];
  undefined1 local_fb8 [16];
  undefined1 *local_fa8 [2];
  undefined1 local_f98 [16];
  undefined1 *local_f88 [2];
  undefined1 local_f78 [16];
  undefined1 *local_f68 [2];
  undefined1 local_f58 [16];
  undefined1 *local_f48 [2];
  undefined1 local_f38 [16];
  undefined1 *local_f28 [2];
  undefined1 local_f18 [16];
  undefined1 *local_f08 [2];
  undefined1 local_ef8 [16];
  undefined1 *local_ee8 [2];
  undefined1 local_ed8 [16];
  undefined1 *local_ec8 [2];
  undefined1 local_eb8 [16];
  undefined1 *local_ea8 [2];
  undefined1 local_e98 [16];
  undefined1 *local_e88 [2];
  undefined1 local_e78 [16];
  undefined1 *local_e68 [2];
  undefined1 local_e58 [16];
  undefined1 *local_e48 [2];
  undefined1 local_e38 [16];
  undefined1 *local_e28 [2];
  undefined1 local_e18 [16];
  undefined1 *local_e08 [2];
  undefined1 local_df8 [16];
  undefined1 *local_de8 [2];
  undefined1 local_dd8 [16];
  undefined1 *local_dc8 [2];
  undefined1 local_db8 [16];
  undefined1 *local_da8 [2];
  undefined1 local_d98 [16];
  undefined1 *local_d88 [2];
  undefined1 local_d78 [16];
  undefined1 *local_d68 [2];
  undefined1 local_d58 [16];
  undefined1 *local_d48 [2];
  undefined1 local_d38 [16];
  undefined1 *local_d28 [2];
  undefined1 local_d18 [16];
  undefined1 *local_d08 [2];
  undefined1 local_cf8 [16];
  undefined1 *local_ce8 [2];
  undefined1 local_cd8 [16];
  undefined1 *local_cc8 [2];
  undefined1 local_cb8 [16];
  undefined1 *local_ca8 [2];
  undefined1 local_c98 [16];
  undefined1 *local_c88 [2];
  undefined1 local_c78 [16];
  undefined1 *local_c68 [2];
  undefined1 local_c58 [16];
  undefined1 *local_c48 [2];
  undefined1 local_c38 [16];
  undefined1 *local_c28 [2];
  undefined1 local_c18 [16];
  undefined1 *local_c08 [2];
  undefined1 local_bf8 [16];
  undefined1 *local_be8 [2];
  undefined1 local_bd8 [16];
  undefined1 *local_bc8 [2];
  undefined1 local_bb8 [16];
  undefined1 *local_ba8 [2];
  undefined1 local_b98 [16];
  undefined1 *local_b88 [2];
  undefined1 local_b78 [16];
  undefined1 *local_b68 [2];
  undefined1 local_b58 [16];
  undefined1 *local_b48 [2];
  undefined1 local_b38 [16];
  undefined1 *local_b28 [2];
  undefined1 local_b18 [16];
  undefined1 *local_b08 [2];
  undefined1 local_af8 [16];
  undefined1 *local_ae8 [2];
  undefined1 local_ad8 [16];
  undefined1 *local_ac8 [2];
  undefined1 local_ab8 [16];
  undefined1 *local_aa8 [2];
  undefined1 local_a98 [16];
  undefined1 *local_a88 [2];
  undefined1 local_a78 [16];
  undefined1 *local_a68 [2];
  undefined1 local_a58 [16];
  undefined1 *local_a48 [2];
  undefined1 local_a38 [16];
  undefined1 *local_a28 [2];
  undefined1 local_a18 [16];
  undefined1 *local_a08 [2];
  undefined1 local_9f8 [16];
  undefined1 *local_9e8 [2];
  undefined1 local_9d8 [16];
  undefined1 *local_9c8 [2];
  undefined1 local_9b8 [16];
  undefined1 *local_9a8 [2];
  undefined1 local_998 [16];
  undefined1 *local_988 [2];
  undefined1 local_978 [16];
  undefined1 *local_968 [2];
  undefined1 local_958 [16];
  undefined1 *local_948 [2];
  undefined1 local_938 [16];
  undefined1 *local_928 [2];
  undefined1 local_918 [16];
  undefined1 *local_908 [2];
  undefined1 local_8f8 [16];
  undefined1 *local_8e8 [2];
  undefined1 local_8d8 [16];
  undefined1 *local_8c8 [2];
  undefined1 local_8b8 [16];
  undefined1 *local_8a8 [2];
  undefined1 local_898 [16];
  undefined1 *local_888 [2];
  undefined1 local_878 [16];
  undefined1 *local_868 [2];
  undefined1 local_858 [16];
  undefined1 *local_848 [2];
  undefined1 local_838 [16];
  undefined1 *local_828 [2];
  undefined1 local_818 [16];
  undefined1 *local_808 [2];
  undefined1 local_7f8 [16];
  undefined1 *local_7e8 [2];
  undefined1 local_7d8 [16];
  undefined1 *local_7c8 [2];
  undefined1 local_7b8 [16];
  undefined1 *local_7a8 [2];
  undefined1 local_798 [16];
  undefined1 *local_788 [2];
  undefined1 local_778 [16];
  undefined1 *local_768 [2];
  undefined1 local_758 [16];
  undefined1 *local_748 [2];
  undefined1 local_738 [16];
  undefined1 *local_728 [2];
  undefined1 local_718 [16];
  undefined1 *local_708 [2];
  undefined1 local_6f8 [16];
  undefined1 *local_6e8 [2];
  undefined1 local_6d8 [16];
  undefined1 *local_6c8 [2];
  undefined1 local_6b8 [16];
  undefined1 *local_6a8 [2];
  undefined1 local_698 [16];
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  undefined1 *local_668 [2];
  undefined1 local_658 [16];
  undefined1 *local_648 [2];
  undefined1 local_638 [16];
  undefined1 *local_628 [2];
  undefined1 local_618 [16];
  undefined1 *local_608 [2];
  undefined1 local_5f8 [16];
  undefined1 *local_5e8 [2];
  undefined1 local_5d8 [16];
  undefined1 *local_5c8 [2];
  undefined1 local_5b8 [16];
  undefined1 *local_5a8 [2];
  undefined1 local_598 [16];
  undefined1 *local_588 [2];
  undefined1 local_578 [16];
  undefined1 *local_568 [2];
  undefined1 local_558 [16];
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined1 *local_4a8 [2];
  undefined1 local_498 [16];
  undefined1 *local_488 [2];
  undefined1 local_478 [16];
  undefined1 *local_468 [2];
  undefined1 local_458 [16];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  long *local_88 [2];
  long local_78 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  GetDefaultMap_abi_cxx11_();
  pcVar1 = local_1b08 + 0x10;
  local_1b08._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b08,"A","");
  local_1ae8._M_p = (pointer)&local_1ad8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ae8,"A","");
  local_1ac8[0] = local_1ab8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1ac8,"A","");
  local_1aa8[0] = local_1a98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1aa8,"A","");
  local_1a88[0] = local_1a78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a88,"B","");
  local_1a68[0] = local_1a58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a68,"U","");
  local_1a48[0] = local_1a38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a48,"U","");
  local_1a28[0] = local_1a18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a28,"O","");
  local_1a08[0] = local_19f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a08,"O","");
  local_19e8[0] = local_19d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_19e8,"A","");
  local_19c8[0] = local_19b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_19c8,"A","");
  local_19a8[0] = local_1998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_19a8,"A","");
  local_1988[0] = local_1978;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1988,"C","");
  local_1968[0] = local_1958;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1968,"D","");
  local_1948[0] = local_1938;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1948,"E","");
  local_1928[0] = local_1918;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1928,"F","");
  local_1908[0] = local_18f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1908,"G","");
  local_18e8[0] = local_18d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_18e8,"H","");
  local_18c8[0] = local_18b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_18c8,"I","");
  local_18a8[0] = local_1898;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_18a8,"J","");
  local_1888[0] = local_1878;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1888,"K","");
  local_1868[0] = local_1858;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1868,"L","");
  local_1848[0] = local_1838;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1848,"M","");
  local_1828[0] = local_1818;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1828,"N","");
  local_1808[0] = local_17f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1808,"O","");
  local_17e8[0] = local_17d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_17e8,"P","");
  local_17c8[0] = local_17b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_17c8,"Q","");
  local_17a8[0] = local_1798;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_17a8,"R","");
  local_1788[0] = local_1778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1788,"S","");
  local_1768[0] = local_1758;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1768,"T","");
  local_1748[0] = local_1738;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1748,"U","");
  local_1728[0] = local_1718;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1728,"V","");
  local_1708[0] = local_16f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1708,"W","");
  local_16e8[0] = local_16d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16e8,"X","");
  local_16c8[0] = local_16b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16c8,"Y","");
  local_16a8[0] = local_1698;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16a8,"Z","");
  local_1688[0] = local_1678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1688,"A","");
  local_1668[0] = local_1658;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1668,"B","");
  local_1648[0] = local_1638;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1648,"C","");
  local_1628[0] = local_1618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1628,"D","");
  local_1608[0] = local_15f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1608,"E","");
  local_15e8[0] = local_15d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15e8,"F","");
  local_15c8[0] = local_15b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15c8,"G","");
  local_15a8[0] = local_1598;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_15a8,"H","");
  local_1588[0] = local_1578;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1588,"I","");
  local_1568[0] = local_1558;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1568,"J","");
  local_1548[0] = local_1538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1548,"K","");
  local_1528[0] = local_1518;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1528,"L","");
  local_1508[0] = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1508,"M","");
  local_14e8[0] = local_14d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14e8,"N","");
  local_14c8[0] = local_14b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14c8,"O","");
  local_14a8[0] = local_1498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14a8,"P","");
  local_1488[0] = local_1478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1488,"Q","");
  local_1468[0] = local_1458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1468,"R","");
  local_1448[0] = local_1438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1448,"S","");
  local_1428[0] = local_1418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1428,"T","");
  local_1408[0] = local_13f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1408,"U","");
  local_13e8[0] = local_13d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13e8,"V","");
  local_13c8[0] = local_13b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13c8,"W","");
  local_13a8[0] = local_1398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13a8,"X","");
  local_1388[0] = local_1378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1388,"Y","");
  local_1368[0] = local_1358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1368,"Z","");
  local_1348[0] = local_1338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1348,"0","");
  local_1328[0] = local_1318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1328,"A","");
  local_1308[0] = local_12f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1308,"B","");
  local_12e8[0] = local_12d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12e8,"C","");
  local_12c8[0] = local_12b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12c8,"D","");
  local_12a8[0] = local_1298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_12a8,"E","");
  local_1288[0] = local_1278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"F","");
  local_1268[0] = local_1258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1268,"G","");
  local_1248[0] = local_1238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1248,"H","");
  local_1228[0] = local_1218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1228,"I","");
  local_1208[0] = local_11f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1208,"J","");
  local_11e8[0] = local_11d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11e8,"K","");
  local_11c8[0] = local_11b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11c8,"L","");
  local_11a8[0] = local_1198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_11a8,"M","");
  local_1188[0] = local_1178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1188,"N","");
  local_1168[0] = local_1158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1168,"O","");
  local_1148[0] = local_1138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1148,"P","");
  local_1128[0] = local_1118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1128,"Q","");
  local_1108[0] = local_10f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1108,"R","");
  local_10e8[0] = local_10d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10e8,"S","");
  local_10c8[0] = local_10b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10c8,"T","");
  local_10a8[0] = local_1098;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10a8,"U","");
  local_1088[0] = local_1078;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1088,"V","");
  local_1068[0] = local_1058;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1068,"W","");
  local_1048[0] = local_1038;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1048,"X","");
  local_1028[0] = local_1018;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1028,"Y","");
  local_1008[0] = local_ff8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1008,"Z","");
  local_fe8[0] = local_fd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fe8,"A","");
  local_fc8[0] = local_fb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fc8,"B","");
  local_fa8[0] = local_f98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fa8,"C","");
  local_f88[0] = local_f78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f88,"D","");
  local_f68[0] = local_f58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f68,"E","");
  local_f48[0] = local_f38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f48,"F","");
  local_f28[0] = local_f18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f28,"G","");
  local_f08[0] = local_ef8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f08,"H","");
  local_ee8[0] = local_ed8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ee8,"I","");
  local_ec8[0] = local_eb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ec8,"J","");
  local_ea8[0] = local_e98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ea8,"K","");
  local_e88[0] = local_e78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e88,"L","");
  local_e68[0] = local_e58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e68,"M","");
  local_e48[0] = local_e38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e48,"N","");
  local_e28[0] = local_e18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e28,"O","");
  local_e08[0] = local_df8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e08,"P","");
  local_de8[0] = local_dd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_de8,"Q","");
  local_dc8[0] = local_db8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_dc8,"R","");
  local_da8[0] = local_d98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_da8,"S","");
  local_d88[0] = local_d78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d88,"T","");
  local_d68[0] = local_d58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d68,"U","");
  local_d48[0] = local_d38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d48,"V","");
  local_d28[0] = local_d18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d28,"W","");
  local_d08[0] = local_cf8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d08,"X","");
  local_ce8[0] = local_cd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ce8,"Y","");
  local_cc8[0] = local_cb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cc8,"Z","");
  local_ca8[0] = local_c98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ca8,"A","");
  local_c88[0] = local_c78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c88,"B","");
  local_c68[0] = local_c58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c68,"C","");
  local_c48[0] = local_c38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c48,"D","");
  local_c28[0] = local_c18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c28,"E","");
  local_c08[0] = local_bf8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c08,"F","");
  local_be8[0] = local_bd8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_be8,"G","");
  local_bc8[0] = local_bb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bc8,"H","");
  local_ba8[0] = local_b98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ba8,"I","");
  local_b88[0] = local_b78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"J","");
  local_b68[0] = local_b58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b68,"K","");
  local_b48[0] = local_b38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b48,"L","");
  local_b28[0] = local_b18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"M","");
  local_b08[0] = local_af8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b08,"N","");
  local_ae8[0] = local_ad8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"O","");
  local_ac8[0] = local_ab8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"P","");
  local_aa8[0] = local_a98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"Q","");
  local_a88[0] = local_a78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a88,"R","");
  local_a68[0] = local_a58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a68,"S","");
  local_a48[0] = local_a38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a48,"T","");
  local_a28[0] = local_a18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a28,"U","");
  local_a08[0] = local_9f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a08,"V","");
  local_9e8[0] = local_9d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"W","");
  local_9c8[0] = local_9b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9c8,"X","");
  local_9a8[0] = local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"Y","");
  local_988[0] = local_978;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_988,"Z","");
  local_968[0] = local_958;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_968,"A","");
  local_948[0] = local_938;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"B","");
  local_928[0] = local_918;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"C","");
  local_908[0] = local_8f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"D","");
  local_8e8[0] = local_8d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8e8,"E","");
  local_8c8[0] = local_8b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"F","");
  local_8a8[0] = local_898;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8a8,"G","");
  local_888[0] = local_878;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_888,"H","");
  local_868[0] = local_858;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_868,"I","");
  local_848[0] = local_838;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"J","");
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"K","");
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"L","");
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"M","");
  local_7c8[0] = local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"N","");
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"O","");
  local_788[0] = local_778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"P","");
  local_768[0] = local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_768,"Q","");
  local_748[0] = local_738;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"R","");
  local_728[0] = local_718;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"S","");
  local_708[0] = local_6f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_708,"T","");
  local_6e8[0] = local_6d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"U","");
  local_6c8[0] = local_6b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6c8,"V","");
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"W","");
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"X","");
  local_668[0] = local_658;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"Y","");
  local_648[0] = local_638;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"Z","");
  local_628[0] = local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"A","");
  local_608[0] = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"B","");
  local_5e8[0] = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"C","");
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"D","");
  local_5a8[0] = local_598;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"E","");
  local_588[0] = local_578;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"F","");
  local_568[0] = local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"G","");
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"H","");
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"I","");
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"J","");
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"K","");
  local_4c8[0] = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"L","");
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"M","");
  local_488[0] = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"N","");
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"O","");
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"P","");
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Q","");
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"R","");
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"S","");
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"T","");
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"U","");
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"V","");
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"W","");
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"X","");
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"Y","");
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"Z","");
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"U","");
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"A","");
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8," ","");
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"S","");
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"M","");
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"O","");
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"L","");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"N","");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"A","");
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"T","");
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"I","");
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"O","");
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"N","");
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"N","");
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"I","");
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"G","");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"N","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"I","");
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"FREE","");
  plVar2 = local_78;
  local_88[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"AE","");
  __l._M_len = 0xd5;
  __l._M_array = (iterator)local_1b08;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b68,__l,(allocator_type *)&local_1b50);
  lVar4 = -0x1aa0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  local_1b08._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b08,anon_var_dwarf_165db,anon_var_dwarf_165db + 2);
  local_1ae8._M_p = (pointer)&local_1ad8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1ae8,anon_var_dwarf_165e7,anon_var_dwarf_165e7 + 3);
  local_1ac8[0] = local_1ab8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1ac8,anon_var_dwarf_165f3,anon_var_dwarf_165f3 + 3);
  local_1aa8[0] = local_1a98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1aa8,anon_var_dwarf_165ff,anon_var_dwarf_165ff + 2);
  local_1a88[0] = local_1a78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a88,anon_var_dwarf_1660b,anon_var_dwarf_1660b + 3);
  local_1a68[0] = local_1a58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a68,anon_var_dwarf_16617,anon_var_dwarf_16617 + 2);
  local_1a48[0] = local_1a38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a48,anon_var_dwarf_16623,anon_var_dwarf_16623 + 2);
  local_1a28[0] = local_1a18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a28,anon_var_dwarf_1662f,anon_var_dwarf_1662f + 2);
  local_1a08[0] = local_19f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a08,anon_var_dwarf_1663b,anon_var_dwarf_1663b + 2);
  local_19e8[0] = local_19d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19e8,anon_var_dwarf_16647,anon_var_dwarf_16647 + 2);
  local_19c8[0] = local_19b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19c8,anon_var_dwarf_16f7d + 0xf,anon_var_dwarf_16f7d + 0x11);
  local_19a8[0] = local_1998;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_19a8,anon_var_dwarf_1665f,anon_var_dwarf_1665f + 3);
  local_1988[0] = local_1978;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1988,anon_var_dwarf_1666b,anon_var_dwarf_1666b + 3);
  local_1968[0] = local_1958;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1968,anon_var_dwarf_16677,anon_var_dwarf_16677 + 3);
  local_1948[0] = local_1938;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1948,anon_var_dwarf_16683,anon_var_dwarf_16683 + 3);
  local_1928[0] = local_1918;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1928,anon_var_dwarf_1668f,anon_var_dwarf_1668f + 3);
  local_1908[0] = local_18f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1908,anon_var_dwarf_1669b,anon_var_dwarf_1669b + 3);
  local_18e8[0] = local_18d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18e8,anon_var_dwarf_166a7,anon_var_dwarf_166a7 + 3);
  local_18c8[0] = local_18b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18c8,anon_var_dwarf_166b3,anon_var_dwarf_166b3 + 3);
  local_18a8[0] = local_1898;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_18a8,anon_var_dwarf_166bf,anon_var_dwarf_166bf + 3);
  local_1888[0] = local_1878;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1888,anon_var_dwarf_166cb,anon_var_dwarf_166cb + 3);
  local_1868[0] = local_1858;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1868,anon_var_dwarf_166d7,anon_var_dwarf_166d7 + 3);
  local_1848[0] = local_1838;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1848,anon_var_dwarf_166e3,anon_var_dwarf_166e3 + 3);
  local_1828[0] = local_1818;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1828,anon_var_dwarf_166ef,anon_var_dwarf_166ef + 3);
  local_1808[0] = local_17f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1808,anon_var_dwarf_166fb,anon_var_dwarf_166fb + 3);
  local_17e8[0] = local_17d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17e8,anon_var_dwarf_16707,anon_var_dwarf_16707 + 3);
  local_17c8[0] = local_17b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17c8,anon_var_dwarf_16713,anon_var_dwarf_16713 + 3);
  local_17a8[0] = local_1798;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_17a8,anon_var_dwarf_1671f,anon_var_dwarf_1671f + 3);
  local_1788[0] = local_1778;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1788,anon_var_dwarf_1672b,anon_var_dwarf_1672b + 3);
  local_1768[0] = local_1758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1768,anon_var_dwarf_16737,anon_var_dwarf_16737 + 3);
  local_1748[0] = local_1738;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1748,anon_var_dwarf_16743,anon_var_dwarf_16743 + 3);
  local_1728[0] = local_1718;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1728,anon_var_dwarf_1674f,anon_var_dwarf_1674f + 3);
  local_1708[0] = local_16f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1708,anon_var_dwarf_1675b,anon_var_dwarf_1675b + 3);
  local_16e8[0] = local_16d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16e8,anon_var_dwarf_16767,anon_var_dwarf_16767 + 3);
  local_16c8[0] = local_16b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16c8,anon_var_dwarf_16f95 + 0x60,anon_var_dwarf_16f95 + 99);
  local_16a8[0] = local_1698;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16a8,anon_var_dwarf_1677f,anon_var_dwarf_1677f + 3);
  local_1688[0] = local_1678;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1688,anon_var_dwarf_1678b,anon_var_dwarf_1678b + 3);
  local_1668[0] = local_1658;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1668,anon_var_dwarf_16797,anon_var_dwarf_16797 + 3);
  local_1648[0] = local_1638;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1648,anon_var_dwarf_167a3,anon_var_dwarf_167a3 + 3);
  local_1628[0] = local_1618;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1628,anon_var_dwarf_167af,anon_var_dwarf_167af + 3);
  local_1608[0] = local_15f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1608,anon_var_dwarf_167bb,anon_var_dwarf_167bb + 3);
  local_15e8[0] = local_15d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15e8,anon_var_dwarf_167c7,anon_var_dwarf_167c7 + 3);
  local_15c8[0] = local_15b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15c8,anon_var_dwarf_167d3,anon_var_dwarf_167d3 + 3);
  local_15a8[0] = local_1598;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15a8,anon_var_dwarf_167df,anon_var_dwarf_167df + 3);
  local_1588[0] = local_1578;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1588,anon_var_dwarf_167eb,anon_var_dwarf_167eb + 3);
  local_1568[0] = local_1558;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1568,anon_var_dwarf_167f7,anon_var_dwarf_167f7 + 3);
  local_1548[0] = local_1538;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1548,anon_var_dwarf_16803,anon_var_dwarf_16803 + 3);
  local_1528[0] = local_1518;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1528,anon_var_dwarf_1680f,anon_var_dwarf_1680f + 3);
  local_1508[0] = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1508,anon_var_dwarf_1681b,anon_var_dwarf_1681b + 3);
  local_14e8[0] = local_14d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14e8,anon_var_dwarf_16827,anon_var_dwarf_16827 + 3);
  local_14c8[0] = local_14b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14c8,anon_var_dwarf_16833,anon_var_dwarf_16833 + 3);
  local_14a8[0] = local_1498;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14a8,anon_var_dwarf_1683f,anon_var_dwarf_1683f + 3);
  local_1488[0] = local_1478;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1488,anon_var_dwarf_1684b,anon_var_dwarf_1684b + 3);
  local_1468[0] = local_1458;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1468,anon_var_dwarf_16857,anon_var_dwarf_16857 + 3);
  local_1448[0] = local_1438;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1448,anon_var_dwarf_16863,anon_var_dwarf_16863 + 3);
  local_1428[0] = local_1418;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1428,anon_var_dwarf_1686f,anon_var_dwarf_1686f + 3);
  local_1408[0] = local_13f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1408,anon_var_dwarf_1687b,anon_var_dwarf_1687b + 3);
  local_13e8[0] = local_13d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13e8,anon_var_dwarf_16887,anon_var_dwarf_16887 + 3);
  local_13c8[0] = local_13b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13c8,anon_var_dwarf_16893,anon_var_dwarf_16893 + 3);
  local_13a8[0] = local_1398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13a8,anon_var_dwarf_1689f,anon_var_dwarf_1689f + 3);
  local_1388[0] = local_1378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1388,anon_var_dwarf_168ab,anon_var_dwarf_168ab + 3);
  local_1368[0] = local_1358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1368,anon_var_dwarf_168b7,anon_var_dwarf_168b7 + 3);
  local_1348[0] = local_1338;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1348,anon_var_dwarf_16fc9 + 0x51,anon_var_dwarf_16fc9 + 0x54);
  local_1328[0] = local_1318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1328,anon_var_dwarf_168cf,anon_var_dwarf_168cf + 4);
  local_1308[0] = local_12f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1308,anon_var_dwarf_168db,anon_var_dwarf_168db + 4);
  local_12e8[0] = local_12d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12e8,anon_var_dwarf_168e7,anon_var_dwarf_168e7 + 4);
  local_12c8[0] = local_12b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12c8,anon_var_dwarf_168f3,anon_var_dwarf_168f3 + 4);
  local_12a8[0] = local_1298;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12a8,anon_var_dwarf_15bad,anon_var_dwarf_15bad + 4);
  local_1288[0] = local_1278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1288,anon_var_dwarf_168ff,anon_var_dwarf_168ff + 4);
  local_1268[0] = local_1258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1268,anon_var_dwarf_15889,anon_var_dwarf_15889 + 4);
  local_1248[0] = local_1238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1248,anon_var_dwarf_1690b,anon_var_dwarf_1690b + 4);
  local_1228[0] = local_1218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1228,anon_var_dwarf_14f35,anon_var_dwarf_14f35 + 4);
  local_1208[0] = local_11f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1208,anon_var_dwarf_16917,anon_var_dwarf_16917 + 4);
  local_11e8[0] = local_11d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11e8,anon_var_dwarf_16923,anon_var_dwarf_16923 + 4);
  local_11c8[0] = local_11b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11c8,anon_var_dwarf_1692f,anon_var_dwarf_1692f + 4);
  local_11a8[0] = local_1198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_11a8,anon_var_dwarf_1693b,anon_var_dwarf_1693b + 4);
  local_1188[0] = local_1178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1188,anon_var_dwarf_14aae,anon_var_dwarf_14aae + 4);
  local_1168[0] = local_1158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1168,anon_var_dwarf_16947,anon_var_dwarf_16947 + 4);
  local_1148[0] = local_1138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1148,anon_var_dwarf_16953,anon_var_dwarf_16953 + 4);
  local_1128[0] = local_1118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1128,anon_var_dwarf_1695f,anon_var_dwarf_1695f + 4);
  local_1108[0] = local_10f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1108,anon_var_dwarf_161a1,anon_var_dwarf_161a1 + 4);
  local_10e8[0] = local_10d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10e8,anon_var_dwarf_1696b,anon_var_dwarf_1696b + 4);
  local_10c8[0] = local_10b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10c8,anon_var_dwarf_16977,anon_var_dwarf_16977 + 4);
  local_10a8[0] = local_1098;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_10a8,anon_var_dwarf_16983,anon_var_dwarf_16983 + 4);
  local_1088[0] = local_1078;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1088,anon_var_dwarf_1698f,anon_var_dwarf_1698f + 4);
  local_1068[0] = local_1058;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1068,anon_var_dwarf_1699b,anon_var_dwarf_1699b + 4);
  local_1048[0] = local_1038;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1048,anon_var_dwarf_169a7,anon_var_dwarf_169a7 + 4);
  local_1028[0] = local_1018;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1028,anon_var_dwarf_150cd,anon_var_dwarf_150cd + 4);
  local_1008[0] = local_ff8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1008,anon_var_dwarf_16ffd + 100,anon_var_dwarf_16ffd + 0x68);
  local_fe8[0] = local_fd8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fe8,anon_var_dwarf_169bf,anon_var_dwarf_169bf + 4);
  local_fc8[0] = local_fb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fc8,anon_var_dwarf_169cb,anon_var_dwarf_169cb + 4);
  local_fa8[0] = local_f98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fa8,anon_var_dwarf_169d7,anon_var_dwarf_169d7 + 4);
  local_f88[0] = local_f78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f88,anon_var_dwarf_169e3,anon_var_dwarf_169e3 + 4);
  local_f68[0] = local_f58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f68,anon_var_dwarf_169ef,anon_var_dwarf_169ef + 4);
  local_f48[0] = local_f38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f48,anon_var_dwarf_169fb,anon_var_dwarf_169fb + 4);
  local_f28[0] = local_f18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f28,anon_var_dwarf_16a07,anon_var_dwarf_16a07 + 4);
  local_f08[0] = local_ef8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f08,anon_var_dwarf_16a13,anon_var_dwarf_16a13 + 4);
  local_ee8[0] = local_ed8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ee8,anon_var_dwarf_16a1f,anon_var_dwarf_16a1f + 4);
  local_ec8[0] = local_eb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ec8,anon_var_dwarf_16a2b,anon_var_dwarf_16a2b + 4);
  local_ea8[0] = local_e98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ea8,anon_var_dwarf_16a37,anon_var_dwarf_16a37 + 4);
  local_e88[0] = local_e78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e88,anon_var_dwarf_16a43,anon_var_dwarf_16a43 + 4);
  local_e68[0] = local_e58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e68,anon_var_dwarf_16a4f,anon_var_dwarf_16a4f + 4);
  local_e48[0] = local_e38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e48,anon_var_dwarf_16a5b,anon_var_dwarf_16a5b + 4);
  local_e28[0] = local_e18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e28,anon_var_dwarf_16a67,anon_var_dwarf_16a67 + 4);
  local_e08[0] = local_df8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e08,anon_var_dwarf_16a73,anon_var_dwarf_16a73 + 4);
  local_de8[0] = local_dd8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_de8,anon_var_dwarf_16a7f,anon_var_dwarf_16a7f + 4);
  local_dc8[0] = local_db8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_dc8,anon_var_dwarf_16a8b,anon_var_dwarf_16a8b + 4);
  local_da8[0] = local_d98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_da8,anon_var_dwarf_16a97,anon_var_dwarf_16a97 + 4);
  local_d88[0] = local_d78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d88,anon_var_dwarf_16aa3,anon_var_dwarf_16aa3 + 4);
  local_d68[0] = local_d58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d68,anon_var_dwarf_16aaf,anon_var_dwarf_16aaf + 4);
  local_d48[0] = local_d38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d48,anon_var_dwarf_16abb,anon_var_dwarf_16abb + 4);
  local_d28[0] = local_d18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d28,anon_var_dwarf_16ac7,anon_var_dwarf_16ac7 + 4);
  local_d08[0] = local_cf8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d08,anon_var_dwarf_16ad3,anon_var_dwarf_16ad3 + 4);
  local_ce8[0] = local_cd8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ce8,anon_var_dwarf_16adf,anon_var_dwarf_16adf + 4);
  local_cc8[0] = local_cb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cc8,anon_var_dwarf_17031 + 100,anon_var_dwarf_17031 + 0x68);
  local_ca8[0] = local_c98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ca8,anon_var_dwarf_16af7,anon_var_dwarf_16af7 + 3);
  local_c88[0] = local_c78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c88,anon_var_dwarf_16b03,anon_var_dwarf_16b03 + 3);
  local_c68[0] = local_c58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c68,anon_var_dwarf_16b0f,anon_var_dwarf_16b0f + 3);
  local_c48[0] = local_c38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c48,anon_var_dwarf_16b1b,anon_var_dwarf_16b1b + 2);
  local_c28[0] = local_c18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c28,anon_var_dwarf_15df9,anon_var_dwarf_15df9 + 2);
  local_c08[0] = local_bf8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c08,anon_var_dwarf_16b27,anon_var_dwarf_16b27 + 3);
  local_be8[0] = local_bd8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_be8,anon_var_dwarf_16b33,anon_var_dwarf_16b33 + 3);
  local_bc8[0] = local_bb8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bc8,anon_var_dwarf_16b3f,anon_var_dwarf_16b3f + 3);
  local_ba8[0] = local_b98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ba8,anon_var_dwarf_16b4b,anon_var_dwarf_16b4b + 2);
  local_b88[0] = local_b78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"J","");
  local_b68[0] = local_b58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b68,anon_var_dwarf_16b57,anon_var_dwarf_16b57 + 3);
  local_b48[0] = local_b38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b48,anon_var_dwarf_16b63,anon_var_dwarf_16b63 + 3);
  local_b28[0] = local_b18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b28,anon_var_dwarf_16b6f,anon_var_dwarf_16b6f + 3);
  local_b08[0] = local_af8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b08,anon_var_dwarf_14c71,anon_var_dwarf_14c71 + 3);
  local_ae8[0] = local_ad8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ae8,anon_var_dwarf_16b7b,anon_var_dwarf_16b7b + 2);
  local_ac8[0] = local_ab8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ac8,anon_var_dwarf_16b87,anon_var_dwarf_16b87 + 3);
  local_aa8[0] = local_a98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"Q","");
  local_a88[0] = local_a78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a88,anon_var_dwarf_163b1,anon_var_dwarf_163b1 + 3);
  local_a68[0] = local_a58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a68,anon_var_dwarf_16b93,anon_var_dwarf_16b93 + 3);
  local_a48[0] = local_a38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a48,anon_var_dwarf_16b9f,anon_var_dwarf_16b9f + 3);
  local_a28[0] = local_a18;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a28,anon_var_dwarf_16bab,anon_var_dwarf_16bab + 2);
  local_a08[0] = local_9f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a08,"V","");
  local_9e8[0] = local_9d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9e8,anon_var_dwarf_16bb7,anon_var_dwarf_16bb7 + 3);
  local_9c8[0] = local_9b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9c8,anon_var_dwarf_16bc3,anon_var_dwarf_16bc3 + 2);
  local_9a8[0] = local_998;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9a8,anon_var_dwarf_15331,anon_var_dwarf_15331 + 2);
  local_988[0] = local_978;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_988,anon_var_dwarf_1703d + 0x3e,anon_var_dwarf_1703d + 0x41);
  local_968[0] = local_958;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_968,anon_var_dwarf_16bdb,anon_var_dwarf_16bdb + 4);
  local_948[0] = local_938;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_948,anon_var_dwarf_16be7,anon_var_dwarf_16be7 + 4);
  local_928[0] = local_918;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_928,anon_var_dwarf_16bf3,anon_var_dwarf_16bf3 + 4);
  local_908[0] = local_8f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_908,anon_var_dwarf_16bff,anon_var_dwarf_16bff + 4);
  local_8e8[0] = local_8d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8e8,anon_var_dwarf_15bb9,anon_var_dwarf_15bb9 + 4);
  local_8c8[0] = local_8b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8c8,anon_var_dwarf_16c0b,anon_var_dwarf_16c0b + 4);
  local_8a8[0] = local_898;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8a8,anon_var_dwarf_15895,anon_var_dwarf_15895 + 4);
  local_888[0] = local_878;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_888,anon_var_dwarf_16c17,anon_var_dwarf_16c17 + 4);
  local_868[0] = local_858;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_868,anon_var_dwarf_14f41,anon_var_dwarf_14f41 + 4);
  local_848[0] = local_838;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_848,anon_var_dwarf_16c23,anon_var_dwarf_16c23 + 4);
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_828,anon_var_dwarf_16c2f,anon_var_dwarf_16c2f + 4);
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_808,anon_var_dwarf_16c3b,anon_var_dwarf_16c3b + 4);
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,anon_var_dwarf_16c47,anon_var_dwarf_16c47 + 4);
  local_7c8[0] = local_7b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7c8,anon_var_dwarf_14ab9,anon_var_dwarf_14ab9 + 4);
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7a8,anon_var_dwarf_16c53,anon_var_dwarf_16c53 + 4);
  local_788[0] = local_778;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_788,anon_var_dwarf_16c5f,anon_var_dwarf_16c5f + 4);
  local_768[0] = local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_768,anon_var_dwarf_16c6b,anon_var_dwarf_16c6b + 4);
  local_748[0] = local_738;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_748,anon_var_dwarf_161ad,anon_var_dwarf_161ad + 4);
  local_728[0] = local_718;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_728,anon_var_dwarf_16c77,anon_var_dwarf_16c77 + 4);
  local_708[0] = local_6f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_708,anon_var_dwarf_16c83,anon_var_dwarf_16c83 + 4);
  local_6e8[0] = local_6d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6e8,anon_var_dwarf_16c8f,anon_var_dwarf_16c8f + 4);
  local_6c8[0] = local_6b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6c8,anon_var_dwarf_16c9b,anon_var_dwarf_16c9b + 4);
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6a8,anon_var_dwarf_16ca7,anon_var_dwarf_16ca7 + 4);
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_688,anon_var_dwarf_16cb3,anon_var_dwarf_16cb3 + 4);
  local_668[0] = local_658;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_668,anon_var_dwarf_150d9,anon_var_dwarf_150d9 + 4);
  local_648[0] = local_638;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_648,anon_var_dwarf_17057 + 100,anon_var_dwarf_17057 + 0x68);
  local_628[0] = local_618;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_628,anon_var_dwarf_16ccb,anon_var_dwarf_16ccb + 4);
  local_608[0] = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_608,anon_var_dwarf_16cd7,anon_var_dwarf_16cd7 + 4);
  local_5e8[0] = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5e8,anon_var_dwarf_16ce3,anon_var_dwarf_16ce3 + 4);
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5c8,anon_var_dwarf_16cef,anon_var_dwarf_16cef + 4);
  local_5a8[0] = local_598;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5a8,anon_var_dwarf_16cfb,anon_var_dwarf_16cfb + 4);
  local_588[0] = local_578;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_588,anon_var_dwarf_16d07,anon_var_dwarf_16d07 + 4);
  local_568[0] = local_558;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_568,anon_var_dwarf_16d13,anon_var_dwarf_16d13 + 4);
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_548,anon_var_dwarf_16d1f,anon_var_dwarf_16d1f + 4);
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_528,anon_var_dwarf_16d2b,anon_var_dwarf_16d2b + 4);
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_508,anon_var_dwarf_16d37,anon_var_dwarf_16d37 + 4);
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e8,anon_var_dwarf_16d43,anon_var_dwarf_16d43 + 4);
  local_4c8[0] = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c8,anon_var_dwarf_16d4f,anon_var_dwarf_16d4f + 4);
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4a8,anon_var_dwarf_16d5b,anon_var_dwarf_16d5b + 4);
  local_488[0] = local_478;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_488,anon_var_dwarf_16d67,anon_var_dwarf_16d67 + 4);
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468,anon_var_dwarf_16d73,anon_var_dwarf_16d73 + 4);
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_448,anon_var_dwarf_16d7f,anon_var_dwarf_16d7f + 4);
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_428,anon_var_dwarf_16d8b,anon_var_dwarf_16d8b + 4);
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_408,anon_var_dwarf_16d97,anon_var_dwarf_16d97 + 4);
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e8,anon_var_dwarf_16da3,anon_var_dwarf_16da3 + 4);
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3c8,anon_var_dwarf_16daf,anon_var_dwarf_16daf + 4);
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a8,anon_var_dwarf_16dbb,anon_var_dwarf_16dbb + 4);
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_388,anon_var_dwarf_16dc7,anon_var_dwarf_16dc7 + 4);
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_368,anon_var_dwarf_16dd3,anon_var_dwarf_16dd3 + 4);
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,anon_var_dwarf_16ddf,anon_var_dwarf_16ddf + 4);
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,anon_var_dwarf_16deb,anon_var_dwarf_16deb + 4);
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,anon_var_dwarf_17063 + 100,anon_var_dwarf_17063 + 0x68);
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e8,anon_var_dwarf_16e03,anon_var_dwarf_16e03 + 4);
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c8,anon_var_dwarf_16e0f,anon_var_dwarf_16e0f + 4);
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8," ","");
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,anon_var_dwarf_16e1b,anon_var_dwarf_16e1b + 2);
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_268,anon_var_dwarf_16e27,anon_var_dwarf_16e27 + 3);
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,anon_var_dwarf_16e33,anon_var_dwarf_16e33 + 3);
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,anon_var_dwarf_16e3f,anon_var_dwarf_16e3f + 2);
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_208,anon_var_dwarf_16edf + 0x1a,anon_var_dwarf_16edf + 0x1d);
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,anon_var_dwarf_165f3,anon_var_dwarf_165f3 + 3);
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,anon_var_dwarf_16e57,anon_var_dwarf_16e57 + 3);
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,anon_var_dwarf_16e63,anon_var_dwarf_16e63 + 3);
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,anon_var_dwarf_16e33,anon_var_dwarf_16e33 + 3);
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,anon_var_dwarf_16edf + 0x1a,anon_var_dwarf_16edf + 0x1d);
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_148,anon_var_dwarf_16e6f,anon_var_dwarf_16e6f + 2);
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,anon_var_dwarf_155c5,anon_var_dwarf_155c5 + 2);
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_108,anon_var_dwarf_16f05 + 4,anon_var_dwarf_16f05 + 6);
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,anon_var_dwarf_16e7b,anon_var_dwarf_16e7b + 4);
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,anon_var_dwarf_16e87,anon_var_dwarf_16e87 + 4);
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,anon_var_dwarf_16e93,anon_var_dwarf_16e93 + 4);
  plVar2 = local_78;
  local_88[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,anon_var_dwarf_16e9f,anon_var_dwarf_16e9f + 3);
  __l_00._M_len = 0xd5;
  __l_00._M_array = (iterator)local_1b08;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b50,__l_00,&local_1b69);
  lVar4 = -0x1aa0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  if (local_1b68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1b68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1b08,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((local_1b68.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((local_1b50.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&local_1b38,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1b08);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ae8._M_p != &local_1ad8) {
        operator_delete(local_1ae8._M_p,local_1ad8._M_allocated_capacity + 1);
      }
      if ((pointer)local_1b08._0_8_ != pcVar1) {
        operator_delete((void *)local_1b08._0_8_,local_1b08._16_8_ + 1);
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar3 < (ulong)((long)local_1b68.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1b68.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  this = (ConfusableMatcher *)operator_new(0x2000);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_1b20,&local_1b38);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_bucket_count = 1;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._4_4_ = 0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  ConfusableMatcher::ConfusableMatcher
            (this,&local_1b20,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1b20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b68);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1b38);
  return this;
}

Assistant:

ConfusableMatcher *LidlNormalizerCMSetup()
{
	auto map = GetDefaultMap();

	// Additional test data
	std::vector<std::string> keys = { 
		"A", "A", "A", "A", "B", "U", "U", "O", "O", "A", "A",
		"A", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y",
		"Z", "A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z", "0",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"A", "B", "C", "D", "E", "F", "G", "H", "I", "J", "K", "L", "M", "N", "O", "P", "Q", "R", "S", "T", "U", "V", "W", "X", "Y", "Z",
		"U", "A", " ", "S", "M", "O", "L", "N", "A", "T", "I", "O", "N", "N", "I", "G", "N", "I", "FREE", "AE"
	};
	std::vector<std::string> vals = {
		"\U00000105", "\U0000ab31", "\U00001d43", "\U000000e5", "\U0000249d", "\U000000fc", "\U000000dc", "\U000000f6", "\U000000d6", "\U000000e4", "\U000000c4", "\U0000249c", "\U0000249e", "\U0000249f", "\U000024a0", "\U000024a1", "\U000024a2", "\U000024a3", "\U000024a4", "\U000024a5", "\U000024a6", "\U000024a7", "\U000024a8", "\U000024a9", "\U000024aa", "\U000024ab", "\U000024ac", "\U000024ad", "\U000024ae", "\U000024af", "\U000024b0", "\U000024b1", "\U000024b2", "\U000024b3", "\U000024b4", "\U000024cf", "\U000024d0", "\U000024d1", "\U000024d2", "\U000024d3", "\U000024d4", "\U000024d5", "\U000024d6", "\U000024d7", "\U000024d8", "\U000024d9", "\U000024da", "\U000024db", "\U000024dc", "\U000024dd", "\U000024de", "\U000024df", "\U000024e0", "\U000024e1", "\U000024e2", "\U000024e3", "\U000024e4", "\U000024e5", "\U000024e6", "\U000024e7", "\U000024e8", "\U000024e9", "\U000024ea", "\U0001d552", "\U0001d553", "\U0001d554", "\U0001d555", "\U0001d556", "\U0001d557", "\U0001d558", "\U0001d559", "\U0001d55a", "\U0001d55b", "\U0001d55c", "\U0001d55d", "\U0001d55e", "\U0001d55f", "\U0001d560", "\U0001d561", "\U0001d562", "\U0001d563", "\U0001d564", "\U0001d565", "\U0001d566", "\U0001d567", "\U0001d568", "\U0001d569", "\U0001d56a", "\U0001d56b", "\U0001f130", "\U0001f131", "\U0001f132", "\U0001f133", "\U0001f134", "\U0001f135", "\U0001f136", "\U0001f137", "\U0001f138", "\U0001f139", "\U0001f13a", "\U0001f13b", "\U0001f13c", "\U0001f13d", "\U0001f13e", "\U0001f13f", "\U0001f140", "\U0001f141", "\U0001f142", "\U0001f143", "\U0001f144", "\U0001f145", "\U0001f146", "\U0001f147", "\U0001f148", "\U0001f149", "\U000020b3", "\U00000e3f", "\U000020b5", "\U00000110", "\U00000246", "\U000020a3", "\U000020b2", "\U00002c67", "\U00000142", "\U0000004a", "\U000020ad", "\U00002c60", "\U000020a5", "\U000020a6", "\U000000d8", "\U000020b1", "\U00000051", "\U00002c64", "\U000020b4", "\U000020ae", "\U00000244", "\U00000056", "\U000020a9", "\U000004fe", "\U0000024e", "\U00002c6b", "\U0001d586", "\U0001d587", "\U0001d588", "\U0001d589", "\U0001d58a", "\U0001d58b", "\U0001d58c", "\U0001d58d", "\U0001d58e", "\U0001d58f", "\U0001d590", "\U0001d591", "\U0001d592", "\U0001d593", "\U0001d594", "\U0001d595", "\U0001d596", "\U0001d597", "\U0001d598", "\U0001d599", "\U0001d59a", "\U0001d59b", "\U0001d59c", "\U0001d59d", "\U0001d59e", "\U0001d59f", "\U0001f170", "\U0001f171", "\U0001f172", "\U0001f173", "\U0001f174", "\U0001f175", "\U0001f176", "\U0001f177", "\U0001f178", "\U0001f179", "\U0001f17a", "\U0001f17b", "\U0001f17c", "\U0001f17d", "\U0001f17e", "\U0001f17f", "\U0001f180", "\U0001f181", "\U0001f182", "\U0001f183", "\U0001f184", "\U0001f185", "\U0001f186", "\U0001f187", "\U0001f188", "\U0001f189", "\U0001f1fa", "\U0001f1e6", " ", "\U000002e2", "\U00001d50", "\U00001d52", "\U000002e1", "\U0000207f", "\U00001d43", "\U00001d57", "\U00001da6", "\U00001d52", "\U0000207f", "\U0000041d", "\U00000438", "\U00000433", "\U0001F1F3", "\U0001F1EE", "\U0001f193", "\U00001d2d"
	};
	
	for (auto x = 0;x < keys.size();x++)
		map.push_back(std::pair(keys[x], vals[x]));

	auto matcher = new ConfusableMatcher(map, { });

	return matcher;
}